

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O2

void Gia_ManCollectNodesCis_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 != 0) {
    return;
  }
  Gia_ObjSetTravIdCurrent(p,pObj);
  uVar2 = (uint)*(undefined8 *)pObj;
  if ((~uVar2 & 0x9fffffff) != 0) {
    if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                    ,0xb9,"void Gia_ManCollectNodesCis_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Gia_ManCollectNodesCis_rec(p,pObj + -(ulong)(uVar2 & 0x1fffffff),vNodes);
    Gia_ManCollectNodesCis_rec(p,pObj + -(ulong)(*(uint *)&pObj->field_0x4 & 0x1fffffff),vNodes);
  }
  iVar1 = Gia_ObjId(p,pObj);
  Vec_IntPush(vNodes,iVar1);
  return;
}

Assistant:

void Gia_ManCollectNodesCis_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    if ( Gia_ObjIsCi(pObj) )
    {
        Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
        return;
    }
    assert( Gia_ObjIsAnd(pObj) );
    Gia_ManCollectNodesCis_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Gia_ManCollectNodesCis_rec( p, Gia_ObjFanin1(pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}